

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateBoolLiteral(ExpressionEvalContext *ctx,ExprBoolLiteral *expression)

{
  undefined1 uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  
  pAVar2 = ctx->ctx->allocator;
  iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = (expression->super_ExprBase).type;
  uVar1 = (expression->super_ExprBase).field_0x29;
  pEVar6->typeID = 3;
  pEVar6->source = pSVar3;
  pEVar6->type = pTVar4;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294a0;
  pEVar6->field_0x29 = uVar1;
  pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
  return pEVar6;
}

Assistant:

ExprBase* EvaluateBoolLiteral(ExpressionEvalContext &ctx, ExprBoolLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, expression->value));
}